

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSchur.h
# Opt level: O0

RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> * __thiscall
Eigen::RealSchur<Eigen::Matrix<double,2,2,0,2,2>>::
computeFromHessenberg<Eigen::internal::HessenbergDecompositionMatrixHReturnType<Eigen::Matrix<double,2,2,0,2,2>>,Eigen::HouseholderSequence<Eigen::Matrix<double,2,2,0,2,2>,Eigen::Matrix<double,1,1,0,1,1>,1>>
          (RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *this,
          HessenbergDecompositionMatrixHReturnType<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *matrixH,
          HouseholderSequence<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1>
          *matrixQ,bool computeU)

{
  byte bVar1;
  Index IVar2;
  Vector3s *shiftInfo_00;
  Scalar *im_00;
  Index IVar3;
  Vector3s *firstHouseholderVector_00;
  Vector3s *pVVar4;
  Scalar *pSVar5;
  byte in_CL;
  Scalar *in_RDX;
  RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *in_RSI;
  RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *in_RDI;
  Scalar SVar6;
  double dVar7;
  RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *unaff_retaddr;
  Scalar *in_stack_00000008;
  bool in_stack_00000017;
  Index in_stack_00000018;
  RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *in_stack_00000020;
  Index im;
  Vector3s shiftInfo;
  Vector3s firstHouseholderVector;
  Index il;
  Scalar norm;
  Scalar exshift;
  Index totalIter;
  Index iter;
  Index iu;
  Scalar *workspace;
  Index maxIters;
  Vector3s *in_stack_00000108;
  bool in_stack_00000117;
  Index in_stack_00000118;
  Index in_stack_00000120;
  Index in_stack_00000128;
  RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *in_stack_00000130;
  Scalar *in_stack_00000140;
  EigenBase<Eigen::HouseholderSequence<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1>_>
  *in_stack_ffffffffffffff28;
  Matrix<double,_2,_2,_0,_2,_2> *in_stack_ffffffffffffff30;
  Index in_stack_ffffffffffffff38;
  ColumnVectorType *this_00;
  RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *in_stack_ffffffffffffff50;
  Scalar *in_stack_ffffffffffffff58;
  Matrix<double,_3,_1,_0,_3,_1> *in_stack_ffffffffffffff60;
  long local_48;
  undefined7 in_stack_ffffffffffffffe0;
  RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *iu_00;
  
  bVar1 = in_CL & 1;
  iu_00 = in_RDI;
  Matrix<double,2,2,0,2,2>::operator=
            (in_stack_ffffffffffffff30,
             (ReturnByValue<Eigen::internal::HessenbergDecompositionMatrixHReturnType<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
              *)in_stack_ffffffffffffff28);
  if ((bVar1 & 1) != 0) {
    Matrix<double,2,2,0,2,2>::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  shiftInfo_00 = (Vector3s *)in_RDI->m_maxIters;
  if (shiftInfo_00 == (Vector3s *)0xffffffffffffffff) {
    IVar2 = internal::
            HessenbergDecompositionMatrixHReturnType<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::rows
                      ((HessenbergDecompositionMatrixHReturnType<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>
                        *)0x2e5ea0);
    shiftInfo_00 = (Vector3s *)(IVar2 * 0x28);
  }
  this_00 = &in_RDI->m_workspaceVector;
  PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::cols
            ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)0x2e5ec2);
  PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::resize
            (&this_00->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,
             in_stack_ffffffffffffff38);
  im_00 = PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::coeffRef
                    ((PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)
                     in_stack_ffffffffffffff30,(Index)in_stack_ffffffffffffff28);
  IVar3 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)0x2e5ef3);
  firstHouseholderVector_00 = (Vector3s *)(IVar3 + -1);
  local_48 = 0;
  SVar6 = RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::computeNormOfT(in_RSI);
  if ((SVar6 != 0.0) || (NAN(SVar6))) {
    while (-1 < (long)firstHouseholderVector_00) {
      pVVar4 = (Vector3s *)
               RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::findSmallSubdiagEntry
                         (in_stack_ffffffffffffff50,(Index)in_RDI);
      if (pVVar4 == firstHouseholderVector_00) {
        pSVar5 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeff
                           ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                            in_stack_ffffffffffffff50,(Index)in_RDI,(Index)this_00);
        dVar7 = *pSVar5 + 0.0;
        pSVar5 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeffRef
                           ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                            in_stack_ffffffffffffff50,(Index)in_RDI,(Index)this_00);
        *pSVar5 = dVar7;
        if (0 < (long)firstHouseholderVector_00) {
          pSVar5 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeffRef
                             ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                              in_stack_ffffffffffffff50,(Index)in_RDI,(Index)this_00);
          *pSVar5 = 0.0;
        }
        firstHouseholderVector_00 =
             (Vector3s *)
             ((long)firstHouseholderVector_00[-1].
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                    array + 0x17);
      }
      else if (pVVar4 == (Vector3s *)
                         ((long)firstHouseholderVector_00[-1].
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                m_storage.m_data.array + 0x17)) {
        RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::splitOffTwoRows
                  (in_stack_00000020,in_stack_00000018,in_stack_00000017,in_stack_00000008);
        firstHouseholderVector_00 =
             (Vector3s *)
             ((long)firstHouseholderVector_00[-1].
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                    array + 0x16);
      }
      else {
        Matrix<double,_3,_1,_0,_3,_1>::Matrix
                  (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                   (Scalar *)in_stack_ffffffffffffff50,(Scalar *)in_RDI);
        Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x2e60cf);
        RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::computeShift
                  (unaff_retaddr,(Index)iu_00,(Index)in_RSI,in_RDX,
                   (Vector3s *)CONCAT17(bVar1,in_stack_ffffffffffffffe0));
        local_48 = local_48 + 1;
        if ((long)shiftInfo_00 < local_48) break;
        RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::initFrancisQRStep
                  (in_RSI,(Index)in_RDX,CONCAT17(bVar1,in_stack_ffffffffffffffe0),shiftInfo_00,
                   (Index *)im_00,firstHouseholderVector_00);
        RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::performFrancisQRStep
                  (in_stack_00000130,in_stack_00000128,in_stack_00000120,in_stack_00000118,
                   in_stack_00000117,in_stack_00000108,in_stack_00000140);
      }
    }
  }
  if ((long)shiftInfo_00 < local_48) {
    in_RDI->m_info = NoConvergence;
  }
  else {
    in_RDI->m_info = Success;
  }
  in_RDI->m_isInitialized = true;
  in_RDI->m_matUisUptodate = (bool)(bVar1 & 1);
  return in_RDI;
}

Assistant:

RealSchur<MatrixType>& RealSchur<MatrixType>::computeFromHessenberg(const HessMatrixType& matrixH, const OrthMatrixType& matrixQ,  bool computeU)
{  
  m_matT = matrixH; 
  if(computeU)
    m_matU = matrixQ;
  
  Index maxIters = m_maxIters;
  if (maxIters == -1)
    maxIters = m_maxIterationsPerRow * matrixH.rows();
  m_workspaceVector.resize(m_matT.cols());
  Scalar* workspace = &m_workspaceVector.coeffRef(0);

  // The matrix m_matT is divided in three parts. 
  // Rows 0,...,il-1 are decoupled from the rest because m_matT(il,il-1) is zero. 
  // Rows il,...,iu is the part we are working on (the active window).
  // Rows iu+1,...,end are already brought in triangular form.
  Index iu = m_matT.cols() - 1;
  Index iter = 0;      // iteration count for current eigenvalue
  Index totalIter = 0; // iteration count for whole matrix
  Scalar exshift(0);   // sum of exceptional shifts
  Scalar norm = computeNormOfT();

  if(norm!=0)
  {
    while (iu >= 0)
    {
      Index il = findSmallSubdiagEntry(iu);

      // Check for convergence
      if (il == iu) // One root found
      {
        m_matT.coeffRef(iu,iu) = m_matT.coeff(iu,iu) + exshift;
        if (iu > 0)
          m_matT.coeffRef(iu, iu-1) = Scalar(0);
        iu--;
        iter = 0;
      }
      else if (il == iu-1) // Two roots found
      {
        splitOffTwoRows(iu, computeU, exshift);
        iu -= 2;
        iter = 0;
      }
      else // No convergence yet
      {
        // The firstHouseholderVector vector has to be initialized to something to get rid of a silly GCC warning (-O1 -Wall -DNDEBUG )
        Vector3s firstHouseholderVector(0,0,0), shiftInfo;
        computeShift(iu, iter, exshift, shiftInfo);
        iter = iter + 1;
        totalIter = totalIter + 1;
        if (totalIter > maxIters) break;
        Index im;
        initFrancisQRStep(il, iu, shiftInfo, im, firstHouseholderVector);
        performFrancisQRStep(il, im, iu, computeU, firstHouseholderVector, workspace);
      }
    }
  }
  if(totalIter <= maxIters)
    m_info = Success;
  else
    m_info = NoConvergence;

  m_isInitialized = true;
  m_matUisUptodate = computeU;
  return *this;
}